

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void adjustlocalvars(LexState *ls,int nvars)

{
  int iVar1;
  FuncState *fs;
  LocVar *pLVar2;
  int iVar3;
  
  fs = ls->fs;
  fs->nactvar = fs->nactvar + (char)nvars;
  for (iVar3 = -nvars; iVar3 != 0; iVar3 = iVar3 + 1) {
    iVar1 = fs->pc;
    pLVar2 = getlocvar(fs,(uint)fs->nactvar + iVar3);
    pLVar2->startpc = iVar1;
  }
  if (((byte)ravi_parser_debug & 4) == 0) {
    return;
  }
  raviY_printf(fs,"adjustlocalvars -> set fs->nactvar to %d\n",(ulong)fs->nactvar);
  return;
}

Assistant:

static void adjustlocalvars (LexState *ls, int nvars) {
  FuncState *fs = ls->fs;
  fs->nactvar = cast_byte(fs->nactvar + nvars);
  for (; nvars; nvars--) {
    getlocvar(fs, fs->nactvar - nvars)->startpc = fs->pc;
  }
  DEBUG_VARS(raviY_printf(fs, "adjustlocalvars -> set fs->nactvar to %d\n", fs->nactvar));
}